

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglColorClearCase.cpp
# Opt level: O1

void __thiscall
deqp::egl::SingleThreadColorClearCase::executeForContexts
          (SingleThreadColorClearCase *this,EGLDisplay display,EGLSurface surface,Config *config,
          vector<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_> *contexts)

{
  EGLint EVar1;
  TestLog *log;
  byte bVar2;
  bool bVar3;
  deUint32 dVar4;
  int iVar5;
  Library *egl;
  pointer ppVar6;
  uint uVar7;
  pointer pCVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  void *data;
  int iVar12;
  PixelFormat PVar13;
  vector<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_> clears;
  long local_1b10;
  ClearOp clear;
  Surface refFrame;
  Surface frame;
  Random rnd;
  IVec2 surfaceSize;
  PixelBufferAccess local_1a80;
  ApiFunctions funcs;
  
  egl = EglTestContext::getLibrary
                  ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                   super_TestCase.m_eglTestCtx);
  eglu::getSurfaceSize((eglu *)&surfaceSize,egl,display,surface);
  log = ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.super_TestCase
         .super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::Surface::Surface(&refFrame,surfaceSize.m_data[0],surfaceSize.m_data[1]);
  tcu::Surface::Surface(&frame,surfaceSize.m_data[0],surfaceSize.m_data[1]);
  PVar13 = getPixelFormat(egl,display,config->config);
  dVar4 = deStringHash((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
                       super_TestCase.super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  glw::Functions::Functions(&funcs.gl);
  EglTestContext::initGLFunctions
            ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
             super_TestCase.m_eglTestCtx,&funcs.gl,(ApiType)0x2);
  ppVar6 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar1 = ppVar6->first;
  clear.x = 0;
  clear.y = 0;
  clear.width = surfaceSize.m_data[0];
  clear.height = surfaceSize.m_data[1];
  clear.color.m_value = 0xff000000;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar6->second);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xc6);
  renderClear(EVar1,&funcs,&clear);
  finish(EVar1,&funcs);
  if (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<deqp::egl::ClearOp,std::allocator<deqp::egl::ClearOp>>::
    _M_realloc_insert<deqp::egl::ClearOp_const&>
              ((vector<deqp::egl::ClearOp,std::allocator<deqp::egl::ClearOp>> *)&clears,
               (iterator)
               clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
               _M_impl.super__Vector_impl_data._M_finish,&clear);
  }
  else {
    ((clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
      super__Vector_impl_data._M_finish)->color).m_value = clear.color.m_value;
    (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
     super__Vector_impl_data._M_finish)->x = clear.x;
    (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
     super__Vector_impl_data._M_finish)->y = clear.y;
    (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
     super__Vector_impl_data._M_finish)->width = clear.width;
    (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
     super__Vector_impl_data._M_finish)->height = clear.height;
    clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
    super__Vector_impl_data._M_finish =
         clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  iVar5 = 0;
  do {
    for (ppVar6 = (contexts->
                  super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        ppVar6 != (contexts->
                  super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish; ppVar6 = ppVar6 + 1) {
      EVar1 = ppVar6->first;
      (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar6->second);
      dVar4 = (*egl->_vptr_Library[0x1f])(egl);
      eglu::checkError(dVar4,"eglMakeCurrent",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                       ,0xd6);
      iVar12 = 1;
      do {
        computeRandomClear(&clear,&rnd,surfaceSize.m_data[0],surfaceSize.m_data[1]);
        renderClear(EVar1,&funcs,&clear);
        if (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<deqp::egl::ClearOp,std::allocator<deqp::egl::ClearOp>>::
          _M_realloc_insert<deqp::egl::ClearOp_const&>
                    ((vector<deqp::egl::ClearOp,std::allocator<deqp::egl::ClearOp>> *)&clears,
                     (iterator)
                     clears.
                     super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&clear);
        }
        else {
          ((clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
            _M_impl.super__Vector_impl_data._M_finish)->color).m_value = clear.color.m_value;
          (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
           _M_impl.super__Vector_impl_data._M_finish)->x = clear.x;
          (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
           _M_impl.super__Vector_impl_data._M_finish)->y = clear.y;
          (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
           _M_impl.super__Vector_impl_data._M_finish)->width = clear.width;
          (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
           _M_impl.super__Vector_impl_data._M_finish)->height = clear.height;
          clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl
          .super__Vector_impl_data._M_finish =
               clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        iVar12 = iVar12 + -1;
      } while (iVar12 == 0);
      finish(EVar1,&funcs);
    }
    iVar5 = iVar5 + 1;
  } while (iVar5 != 3);
  ppVar6 = (contexts->
           super__Vector_base<std::pair<int,_void_*>,_std::allocator<std::pair<int,_void_*>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  EVar1 = ppVar6->first;
  (*egl->_vptr_Library[0x27])(egl,display,surface,surface,ppVar6->second);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xea);
  readPixels(EVar1,&funcs,&frame);
  (*egl->_vptr_Library[0x27])(egl,display,0,0,0);
  dVar4 = (*egl->_vptr_Library[0x1f])(egl);
  eglu::checkError(dVar4,"eglMakeCurrent",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglColorClearCase.cpp"
                   ,0xf0);
  local_1b10 = PVar13._8_8_;
  if (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
      super__Vector_impl_data._M_start !=
      clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pCVar8 = clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
             _M_impl.super__Vector_impl_data._M_start;
    do {
      clear.x = 8;
      clear.y = 3;
      data = (void *)refFrame.m_pixels.m_cap;
      if (refFrame.m_pixels.m_cap != 0) {
        data = refFrame.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                (&local_1a80,(TextureFormat *)&clear,refFrame.m_width,refFrame.m_height,1,data);
      tcu::getSubregion((PixelBufferAccess *)&clear,&local_1a80,pCVar8->x,pCVar8->y,0,pCVar8->width,
                        pCVar8->height,1);
      tcu::RGBA::toIVec((RGBA *)&local_1a80);
      tcu::clear((PixelBufferAccess *)&clear,(IVec4 *)&local_1a80);
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != clears.
                       super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  bVar2 = 8 - (char)PVar13.redBits;
  uVar10 = 0;
  if (PVar13.alphaBits != 0 && -1 < local_1b10) {
    uVar10 = 0x1000000 << (8U - (char)PVar13.alphaBits & 0x1f);
  }
  uVar9 = 0x100 << (8U - (char)PVar13.greenBits & 0x1f) | 1 << (bVar2 & 0x1f);
  uVar10 = 0x10000 << (8U - (char)PVar13.blueBits & 0x1f) | uVar9 | uVar10;
  uVar7 = 1 << (bVar2 & 0x1f) & 0xff;
  if (0xfd < uVar7) {
    uVar7 = 0xfe;
  }
  uVar9 = uVar9 >> 8 & 0xff;
  if (0xfd < uVar9) {
    uVar9 = 0xfe;
  }
  uVar11 = uVar10 >> 0x10 & 0xff;
  if (0xfd < uVar11) {
    uVar11 = 0xfe;
  }
  uVar10 = uVar10 >> 0x18;
  if (0xfd < uVar10) {
    uVar10 = 0xfe;
  }
  clear.x = uVar10 * 0x1000000 + (uVar11 << 0x10 | uVar9 << 8 | uVar7) + 0x1010101;
  bVar3 = tcu::pixelThresholdCompare
                    (log,"ComparisonResult","Image comparison result",&refFrame,&frame,
                     (RGBA *)&clear,COMPARE_LOG_RESULT);
  if (!bVar3) {
    tcu::TestContext::setTestResult
              ((this->super_MultiContextRenderCase).super_RenderCase.super_SimpleConfigCase.
               super_TestCase.super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  if (clears.super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(clears.
                    super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)clears.
                          super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)clears.
                          super__Vector_base<deqp::egl::ClearOp,_std::allocator<deqp::egl::ClearOp>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  tcu::Surface::~Surface(&frame);
  tcu::Surface::~Surface(&refFrame);
  return;
}

Assistant:

void SingleThreadColorClearCase::executeForContexts (EGLDisplay display, EGLSurface surface, const Config& config, const std::vector<std::pair<EGLint, EGLContext> >& contexts)
{
	const Library&		egl			= m_eglTestCtx.getLibrary();

	const tcu::IVec2	surfaceSize	= eglu::getSurfaceSize(egl, display, surface);
	const int			width		= surfaceSize.x();
	const int			height		= surfaceSize.y();

	TestLog&			log			= m_testCtx.getLog();

	tcu::Surface		refFrame	(width, height);
	tcu::Surface		frame		(width, height);
	tcu::PixelFormat	pixelFmt	= getPixelFormat(egl, display, config.config);

	de::Random			rnd			(deStringHash(getName()));
	vector<ClearOp>		clears;
	const int			ctxClears	= 2;
	const int			numIters	= 3;

	ApiFunctions		funcs;

	m_eglTestCtx.initGLFunctions(&funcs.gl, glu::ApiType::es(2,0));

	// Clear to black using first context.
	{
		EGLint		api			= contexts[0].first;
		EGLContext	context		= contexts[0].second;
		ClearOp		clear		(0, 0, width, height, RGBA::black());

		egl.makeCurrent(display, surface, surface, context);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent");

		renderClear(api, funcs, clear);
		finish(api, funcs);
		clears.push_back(clear);
	}

	// Render.
	for (int iterNdx = 0; iterNdx < numIters; iterNdx++)
	{
		for (vector<std::pair<EGLint, EGLContext> >::const_iterator ctxIter = contexts.begin(); ctxIter != contexts.end(); ctxIter++)
		{
			EGLint		api			= ctxIter->first;
			EGLContext	context		= ctxIter->second;

			egl.makeCurrent(display, surface, surface, context);
			EGLU_CHECK_MSG(egl, "eglMakeCurrent");

			for (int clearNdx = 0; clearNdx < ctxClears; clearNdx++)
			{
				ClearOp clear = computeRandomClear(rnd, width, height);

				renderClear(api, funcs, clear);
				clears.push_back(clear);
			}

			finish(api, funcs);
		}
	}

	// Read pixels using first context. \todo [pyry] Randomize?
	{
		EGLint		api		= contexts[0].first;
		EGLContext	context	= contexts[0].second;

		egl.makeCurrent(display, surface, surface, context);
		EGLU_CHECK_MSG(egl, "eglMakeCurrent");

		readPixels(api, funcs, frame);
	}

	egl.makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT);
	EGLU_CHECK_MSG(egl, "eglMakeCurrent");

	// Render reference.
	renderReference(refFrame, clears, pixelFmt);

	// Compare images
	{
		bool imagesOk = tcu::pixelThresholdCompare(log, "ComparisonResult", "Image comparison result", refFrame, frame, RGBA(1,1,1,1) + pixelFmt.getColorThreshold(), tcu::COMPARE_LOG_RESULT);

		if (!imagesOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
	}
}